

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBuilderCableANCF::BuildBeam
          (ChBuilderCableANCF *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionCable> *sect,int N,ChVector<double> *A,
          ChVector<double> *B)

{
  undefined8 *puVar1;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  *this_00;
  ChMesh *pCVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  ChElementCableANCF *this_01;
  pointer psVar7;
  value_type *__x;
  ulong uVar8;
  int iVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  shared_ptr<chrono::fea::ChElementCableANCF> element;
  shared_ptr<chrono::fea::ChNodeFEAxyzD> nodeB;
  shared_ptr<chrono::fea::ChNodeFEAxyzD> nodeA;
  ChVector<double> v_1;
  ChVector<double> v;
  value_type local_128;
  value_type local_118;
  ulong local_100;
  value_type local_f8;
  element_type *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  undefined8 local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  undefined8 local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  shared_ptr<chrono::fea::ChElementBase> local_b8;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_a8;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_98;
  double local_88;
  shared_ptr<chrono::fea::ChBeamSectionCable> *local_80;
  ChBuilderCableANCF *local_78;
  ChVector<double> *local_70;
  ChVector<double> local_68;
  ChVector<double> local_48;
  
  local_100 = CONCAT44(local_100._4_4_,N);
  local_80 = sect;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementCableANCF>,_std::allocator<std::shared_ptr<chrono::fea::ChElementCableANCF>_>_>
  ::clear(&this->beam_elems);
  this_00 = &this->beam_nodes;
  local_78 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ::clear(this_00);
  dVar11 = B->m_data[1] - A->m_data[1];
  dVar4 = B->m_data[0] - A->m_data[0];
  dVar5 = B->m_data[2] - A->m_data[2];
  local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar4;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar11 * dVar11;
  auVar10 = vfmadd231sd_fma(auVar14,auVar10,auVar10);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar5;
  auVar10 = vfmadd231sd_fma(auVar10,auVar12,auVar12);
  auVar10 = vsqrtsd_avx(auVar10,auVar10);
  bVar6 = 2.2250738585072014e-308 <= auVar10._0_8_;
  dVar13 = 1.0 / auVar10._0_8_;
  local_48.m_data[0] =
       (double)((ulong)bVar6 * (long)(dVar4 * dVar13) + (ulong)!bVar6 * 0x3ff0000000000000);
  local_48.m_data[1] = (double)((ulong)bVar6 * (long)(dVar11 * dVar13));
  local_48.m_data[2] = (double)((ulong)bVar6 * (long)(dVar5 * dVar13));
  local_70 = B;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyzD,std::allocator<chrono::fea::ChNodeFEAxyzD>,chrono::ChVector<double>const&,chrono::ChVector<double>&>
            (&local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyzD **)&local_f8,
             (allocator<chrono::fea::ChNodeFEAxyzD> *)&local_68,A,&local_48);
  pCVar2 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_98.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChMesh::AddNode(pCVar2,&local_98);
  uVar8 = local_100;
  iVar9 = (int)local_100;
  if (local_98.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ::push_back(this_00,&local_f8);
  if (0 < iVar9) {
    local_88 = (double)iVar9;
    local_100 = (uVar8 & 0xffffffff) << 4;
    iVar9 = 1;
    uVar8 = 0;
    do {
      auVar10 = *(undefined1 (*) [16])A->m_data;
      local_118.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      auVar12 = vsubpd_avx(*(undefined1 (*) [16])local_70->m_data,auVar10);
      dVar11 = (double)iVar9 / local_88;
      local_68.m_data[2] = A->m_data[2] + dVar11 * (local_70->m_data[2] - A->m_data[2]);
      local_68.m_data[0] = auVar10._0_8_ + dVar11 * auVar12._0_8_;
      local_68.m_data[1] = auVar10._8_8_ + dVar11 * auVar12._8_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChNodeFEAxyzD,std::allocator<chrono::fea::ChNodeFEAxyzD>,chrono::ChVector<double>&,chrono::ChVector<double>&>
                (&local_118.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(ChNodeFEAxyzD **)&local_118,
                 (allocator<chrono::fea::ChNodeFEAxyzD> *)&local_128,&local_68,&local_48);
      pCVar2 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_a8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_118.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_a8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_118.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_118.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_118.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_118.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_118.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_118.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChMesh::AddNode(pCVar2,&local_a8);
      if (local_a8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.
                   super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      __x = &local_118;
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
      ::push_back(this_00,__x);
      this_01 = (ChElementCableANCF *)
                ChElementCableANCF::operator_new((ChElementCableANCF *)0xa40,(size_t)__x);
      ChElementCableANCF::ChElementCableANCF(this_01);
      local_128.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChElementCableANCF*>
                (&local_128.
                  super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,this_01);
      pCVar2 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_b8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_128.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_b8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_128.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_128.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_128.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_128.
                super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_128.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_128.
                super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChMesh::AddElement(pCVar2,&local_b8);
      if (local_b8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.
                   super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChElementCableANCF>,_std::allocator<std::shared_ptr<chrono::fea::ChElementCableANCF>_>_>
      ::push_back(&local_78->beam_elems,&local_128);
      psVar7 = (this_00->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (undefined8 *)
               ((long)&(psVar7->
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + uVar8);
      local_c8 = *puVar1;
      p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
      lVar3 = *(long *)((long)&(psVar7->
                               super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                               )._M_refcount._M_pi + uVar8);
      if (lVar3 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
          UNLOCK();
          psVar7 = (this_00->
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
        }
      }
      puVar1 = (undefined8 *)
               ((long)&psVar7[1].
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + uVar8);
      local_d8 = *puVar1;
      p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
      lVar3 = *(long *)((long)&psVar7[1].
                               super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + uVar8);
      if (lVar3 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
        }
      }
      (*((local_128.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
        _vptr_ChElementBase[0x1a])
                (local_128.
                 super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,&local_c8,&local_d8);
      if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
      }
      if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
      }
      local_e8 = (local_80->
                 super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
      local_e0._M_pi =
           (local_80->
           super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_e0._M_pi)->_M_use_count = (local_e0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_e0._M_pi)->_M_use_count = (local_e0._M_pi)->_M_use_count + 1;
        }
      }
      ((local_128.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->section).
      super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_e8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&((local_128.
                    super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&local_e0);
      if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
      }
      if (local_128.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_128.
                   super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_118.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      iVar9 = iVar9 + 1;
      uVar8 = uVar8 + 0x10;
    } while (local_100 != uVar8);
  }
  if (local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChBuilderCableANCF::BuildBeam(std::shared_ptr<ChMesh> mesh,              // mesh to store the resulting elements
                                   std::shared_ptr<ChBeamSectionCable> sect,  // section material for beam elements
                                   const int N,                               // number of elements in the segment
                                   const ChVector<> A,                        // starting point
                                   const ChVector<> B                         // ending point
) {
    beam_elems.clear();
    beam_nodes.clear();

    ChVector<> bdir = (B - A);
    bdir.Normalize();

    auto nodeA = chrono_types::make_shared<ChNodeFEAxyzD>(A, bdir);
    mesh->AddNode(nodeA);
    beam_nodes.push_back(nodeA);

    for (int i = 1; i <= N; ++i) {
        double eta = (double)i / (double)N;
        ChVector<> pos = A + (B - A) * eta;

        auto nodeB = chrono_types::make_shared<ChNodeFEAxyzD>(pos, bdir);
        mesh->AddNode(nodeB);
        beam_nodes.push_back(nodeB);

        auto element = chrono_types::make_shared<ChElementCableANCF>();
        mesh->AddElement(element);
        beam_elems.push_back(element);

        element->SetNodes(beam_nodes[i - 1], beam_nodes[i]);

        element->SetSection(sect);
    }
}